

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

float deqp::gles3::Functional::MatrixCaseUtils::determinant<3>(Matrix<float,_3,_3> *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float *pfVar18;
  Matrix<float,_3,_3> *mat_local;
  
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,0,0);
  fVar1 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,1,1);
  fVar2 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,2,2);
  fVar3 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,0,1);
  fVar4 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,1,2);
  fVar5 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,2,0);
  fVar6 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,0,2);
  fVar7 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,1,0);
  fVar8 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,2,1);
  fVar9 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,0,0);
  fVar10 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,1,2);
  fVar11 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,2,1);
  fVar12 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,0,1);
  fVar13 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,1,0);
  fVar14 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,2,2);
  fVar15 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,0,2);
  fVar16 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,1,1);
  fVar17 = *pfVar18;
  pfVar18 = tcu::Matrix<float,_3,_3>::operator()(mat,2,0);
  return -(fVar16 * fVar17) * *pfVar18 +
         -(fVar13 * fVar14) * fVar15 +
         -(fVar10 * fVar11) * fVar12 +
         fVar7 * fVar8 * fVar9 + fVar1 * fVar2 * fVar3 + fVar4 * fVar5 * fVar6;
}

Assistant:

float determinant<3> (const tcu::Matrix<float, 3, 3>& mat)
{
	return	+ mat(0,0) * mat(1,1) * mat(2,2)
			+ mat(0,1) * mat(1,2) * mat(2,0)
			+ mat(0,2) * mat(1,0) * mat(2,1)
			- mat(0,0) * mat(1,2) * mat(2,1)
			- mat(0,1) * mat(1,0) * mat(2,2)
			- mat(0,2) * mat(1,1) * mat(2,0);
}